

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixot.cpp
# Opt level: O1

TPZStructMatrixOT<std::complex<double>_> * __thiscall
TPZStructMatrixOT<std::complex<double>_>::operator=
          (TPZStructMatrixOT<std::complex<double>_> *this,
          TPZStructMatrixOT<std::complex<double>_> *copy)

{
  long lVar1;
  long lVar2;
  
  lVar1 = *(long *)(*(long *)this + -0x60);
  lVar2 = *(long *)(*(long *)copy + -0x60);
  *(undefined1 *)((long)&(this->fElBlocked)._vptr_TPZVec + lVar1 + 4) =
       *(undefined1 *)((long)&(copy->fElBlocked)._vptr_TPZVec + lVar2 + 4);
  *(undefined4 *)((long)&(this->fElBlocked)._vptr_TPZVec + lVar1) =
       *(undefined4 *)((long)&(copy->fElBlocked)._vptr_TPZVec + lVar2);
  TPZVec<long>::operator=(&this->fElBlocked,&copy->fElBlocked);
  TPZVec<long>::operator=(&this->fElSequenceColor,&copy->fElSequenceColor);
  TPZVec<long>::operator=(&this->fElementsComputed,&copy->fElementsComputed);
  this->fElementCompleted = copy->fElementCompleted;
  return this;
}

Assistant:

TPZStructMatrixOT<TVar>& TPZStructMatrixOT<TVar>::operator=(const TPZStructMatrixOT &copy){
    TPZStrMatParInterface::operator=(copy);
    fElBlocked = copy.fElBlocked;
    fElSequenceColor = copy.fElSequenceColor;
    fElementsComputed = copy.fElementsComputed;
    fElementCompleted = copy.fElementCompleted;
    //fSomeoneisSleeping //no need
    //fCurrentIndex //no need
    return *this;
}